

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wav_file.cc
# Opt level: O3

void __thiscall webrtc::WavWriter::WriteSamples(WavWriter *this,float *samples,size_t num_samples)

{
  size_t sVar1;
  ulong uVar2;
  size_t size;
  int16_t isamples [2048];
  int16_t local_1038 [2052];
  
  if (num_samples != 0) {
    uVar2 = 0;
    sVar1 = num_samples;
    do {
      size = 0x800;
      if (sVar1 < 0x800) {
        size = sVar1;
      }
      FloatS16ToS16(samples,size,local_1038);
      WriteSamples(this,local_1038,size);
      uVar2 = uVar2 + 0x800;
      samples = samples + 0x800;
      sVar1 = sVar1 - 0x800;
    } while (uVar2 < num_samples);
  }
  return;
}

Assistant:

void WavWriter::WriteSamples(const float* samples, size_t num_samples) {
  static const size_t kChunksize = 4096 / sizeof(uint16_t);
  for (size_t i = 0; i < num_samples; i += kChunksize) {
    int16_t isamples[kChunksize];
    const size_t chunk = std::min(kChunksize, num_samples - i);
    FloatS16ToS16(samples + i, chunk, isamples);
    WriteSamples(isamples, chunk);
  }
}